

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chip8.cpp
# Opt level: O1

void __thiscall Chip8::OP_FX33(Chip8 *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"LD B",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", V",3);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "                  ; Store BCD representation of Vx in memory locations I, I+1, and I+2."
             ,0x57);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Chip8::OP_FX33() {
    std::cout << "LD B" << ", V"<<((opcode & 0x0F00u) >> 8u) << "                  ; Store BCD representation of Vx in memory locations I, I+1, and I+2." << std::endl;
}